

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus
ZydisDecoderDecodeInstruction
          (ZydisDecoder *decoder,ZydisDecoderContext *context,void *buffer,ZyanUSize length,
          ZydisDecodedInstruction *instruction)

{
  undefined4 uVar1;
  undefined7 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  ZyanStatus ZVar6;
  ZydisDecoder *pZVar7;
  ulong uVar8;
  ZydisDecoderContext *pZVar9;
  ZyanU8 ZVar10;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ZydisMachineMode ZVar16;
  ulong uVar17;
  ulong uVar18;
  ZyanU8 *pZVar19;
  ZyanUSize ZVar20;
  ulong uVar21;
  bool bVar22;
  ZydisDecoderContext default_context;
  byte local_ce;
  ZyanU8 local_cd;
  ZyanU8 local_cc;
  ZyanU8 local_cb;
  ZyanBool local_ca;
  ZyanU8 local_c9;
  byte local_c8;
  ZyanU8 local_c7;
  byte local_c6;
  ZyanU8 local_c5;
  uint local_c4;
  ZydisDecoderState local_c0;
  ulong local_90;
  ZydisDecoder *local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ZydisDecoderContext *local_58;
  ZydisDecoderContext local_50;
  
  ZVar6 = 0x80100004;
  if (((buffer != (void *)0x0) && (decoder != (ZydisDecoder *)0x0)) &&
     (instruction != (ZydisDecodedInstruction *)0x0)) {
    if (length == 0) {
      ZVar6 = 0x80200000;
    }
    else {
      local_c0.prefixes.has_lock = '\0';
      local_c0.prefixes.group1 = '\0';
      local_c0.prefixes.group2 = '\0';
      local_c0.prefixes.effective_segment = '\0';
      local_c0.prefixes.mandatory_candidate = '\0';
      local_c0.prefixes.offset_lock = '\0';
      local_c0.prefixes.offset_group1 = '\0';
      local_c0.prefixes.offset_group2 = '\0';
      local_c0.context = context;
      if (context == (ZydisDecoderContext *)0x0) {
        local_c0.context = &local_50;
      }
      local_c0.prefixes.offset_osz_override = '\0';
      local_c0.prefixes.offset_asz_override = '\0';
      local_c0.prefixes.offset_segment = '\0';
      local_c0.prefixes.offset_mandatory = '\0';
      local_c0.prefixes.offset_notrack = -1;
      local_c0._45_3_ = 0;
      *(undefined8 *)&((local_c0.context)->vector_unified).R2 = 0;
      *(undefined8 *)&((local_c0.context)->reg_info).id_base = 0;
      (local_c0.context)->definition = (void *)0x0;
      (local_c0.context)->eosz_index = '\0';
      (local_c0.context)->easz_index = '\0';
      ((local_c0.context)->vector_unified).W = '\0';
      ((local_c0.context)->vector_unified).R = '\0';
      ((local_c0.context)->vector_unified).X = '\0';
      ((local_c0.context)->vector_unified).B = '\0';
      ((local_c0.context)->vector_unified).L = '\0';
      ((local_c0.context)->vector_unified).LL = '\0';
      local_80 = 0;
      local_c0.decoder = decoder;
      local_c0.buffer = (ZyanU8 *)buffer;
      local_c0.buffer_len = length;
      local_58 = context;
      memset(instruction,0,0x148);
      uVar3 = local_c0._40_8_;
      instruction->machine_mode = decoder->machine_mode;
      instruction->stack_width = (ZyanU8)(0x10 << ((char)decoder->stack_width & 0x1f));
      local_cb = local_c0.prefixes.offset_asz_override;
      local_cc = local_c0.prefixes.offset_osz_override;
      local_c4 = (uint)local_c0.prefixes.mandatory_candidate;
      uVar18 = (ulong)local_c0._40_8_ >> 0x18 & 0xff;
      local_ce = local_c0.prefixes.group2;
      local_cd = local_c0.prefixes.offset_group2;
      local_c6 = local_c0.prefixes.effective_segment;
      local_c5 = local_c0.prefixes.offset_segment;
      uVar14 = (ulong)local_c0._40_8_ >> 0x20 & 0xff;
      local_c8 = local_c0.prefixes.group1;
      local_c7 = local_c0.prefixes.offset_group1;
      local_ca = local_c0.prefixes.has_lock;
      local_c9 = local_c0.prefixes.offset_lock;
      local_78 = 0;
      local_68 = 0;
      local_70 = 0;
      local_90 = 0;
      local_60 = 0;
      uVar17 = 0;
      uVar13 = 0;
      uVar11 = 0;
      pZVar19 = (ZyanU8 *)buffer;
      ZVar20 = 1;
      do {
        if (ZVar20 == 0) {
          return 0x80200000;
        }
        bVar5 = *(byte *)((long)buffer + uVar11);
        uVar21 = CONCAT71((int7)(ZVar20 >> 8),bVar5);
        uVar15 = (uint)bVar5;
        ZVar10 = (ZyanU8)uVar11;
        bVar12 = (byte)uVar13;
        if (uVar15 < 0x67) {
          pZVar7 = (ZydisDecoder *)(ulong)(uVar15 - 0x26);
          if (uVar15 - 0x26 < 0x40) {
            if ((0x1010101UL >> ((ulong)pZVar7 & 0x3f) & 1) == 0) {
              if ((0xc000000000000000U >> ((ulong)pZVar7 & 0x3f) & 1) == 0) goto LAB_0010ee80;
            }
            else {
              pZVar7 = decoder;
              if (decoder->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
                uVar8 = uVar14 & 0xff;
                uVar14 = uVar11 & 0xffffffff;
                if (((byte)local_60 & 0xfe) == 100) {
                  uVar14 = uVar8;
                }
                if (bVar5 != 0x3e) {
                  uVar14 = uVar8;
                }
                local_80 = uVar11 & 0xff;
                local_78 = uVar21 & 0xffffffff;
                local_ce = bVar5;
                local_cd = ZVar10;
                goto LAB_0010ef08;
              }
            }
            uVar14 = 0xff;
            local_80 = CONCAT71((int7)((ulong)pZVar7 >> 8),ZVar10);
            local_78 = uVar21 & 0xffffffff;
            local_ce = bVar5;
            local_cd = ZVar10;
            local_c6 = bVar5;
            local_c5 = ZVar10;
            local_60 = local_78;
            goto LAB_0010ef08;
          }
LAB_0010ee80:
          if (uVar15 == 0x66) {
            bVar22 = (char)uVar17 == '\0';
            uVar18 = uVar18 & 0xff;
            if (bVar22) {
              uVar18 = uVar11 & 0xffffffff;
            }
            local_c4 = local_c4 & 0xff;
            if (bVar22) {
              local_c4 = 0x66;
            }
            uVar17 = uVar17 & 0xff;
            if (bVar22) {
              uVar17 = 0x66;
            }
            local_90 = local_90 | 0x80000000000;
            instruction->attributes = local_90;
            local_70 = CONCAT71((int7)(local_90 >> 8),ZVar10);
            local_cc = ZVar10;
            goto LAB_0010ef08;
          }
LAB_0010ef51:
          ZVar16 = decoder->machine_mode;
          if (((bVar5 & 0xf0) != 0x40) || (ZVar16 != ZYDIS_MACHINE_MODE_LONG_64)) {
            local_c0.prefixes._0_8_ = (ulong)(byte)local_c4 << 0x20;
            local_c0.prefixes._0_7_ = (uint7)CONCAT51(local_c0.prefixes._3_5_,local_ce) << 0x10;
            uVar2 = local_c0.prefixes._0_7_;
            local_c0.prefixes.offset_group2 = local_cd;
            local_c0.prefixes._0_3_ = SUB73(uVar2,0);
            local_c0.prefixes.effective_segment = local_c6;
            local_c0.prefixes._8_3_ = CONCAT12(local_c5,CONCAT11(local_cb,local_cc));
            uVar1 = (undefined4)CONCAT53((int5)uVar18,local_c0.prefixes._8_3_);
            local_c0._45_3_ = SUB83(uVar3,5);
            local_c0.prefixes.offset_notrack = (char)uVar14;
            local_c0.prefixes.offset_osz_override = (char)uVar1;
            local_c0.prefixes.offset_asz_override = (char)((uint)uVar1 >> 8);
            local_c0.prefixes.offset_segment = (char)((uint)uVar1 >> 0x10);
            local_c0.prefixes.offset_mandatory = (char)((uint)uVar1 >> 0x18);
            local_c0.prefixes._0_6_ = (int6)CONCAT61(local_c0.prefixes._2_6_,local_c8) << 8;
            local_c0.prefixes.offset_group1 = local_c7;
            uVar3 = local_c0.prefixes._0_8_;
            local_c0.prefixes.has_lock = local_ca;
            uVar4 = local_c0.prefixes._0_8_;
            local_c0.prefixes._6_2_ = SUB82(uVar3,6);
            local_c0.prefixes._0_5_ = SUB85(uVar4,0);
            local_c0.prefixes.offset_lock = local_c9;
            if ((local_90 & 0x80000000000) != 0) {
              (instruction->raw).prefixes[local_70 & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
            }
            if ((local_90 & 0x100000000000) != 0) {
              (instruction->raw).prefixes[local_68 & 0xff].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
            }
            local_88 = decoder;
            if (bVar12 != 0) {
              (instruction->raw).prefixes[(instruction->raw).field_3.rex.offset].type =
                   ZYDIS_PREFIX_TYPE_EFFECTIVE;
              if ((bVar12 & 0xf0) != 0x40) {
                __assert_fail("(data & 0xF0) == 0x40",
                              "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                              ,0x17a,
                              "void ZydisDecodeREX(ZydisDecoderContext *, ZydisDecodedInstruction *, ZyanU8)"
                             );
              }
              bVar5 = (byte)(uVar13 >> 3) & 1;
              instruction->attributes = local_90 | 4;
              (instruction->raw).field_3.rex.W = bVar5;
              (instruction->raw).field_3.rex.R = (byte)(uVar13 >> 2) & 1;
              (instruction->raw).field_3.rex.X = (byte)(uVar13 >> 1) & 1;
              (instruction->raw).field_3.rex.B = bVar12 & 1;
              pZVar9 = &local_50;
              if (local_58 != (ZydisDecoderContext *)0x0) {
                pZVar9 = local_58;
              }
              (pZVar9->vector_unified).W = bVar5;
              (pZVar9->vector_unified).R = (instruction->raw).field_3.rex.R;
              (pZVar9->vector_unified).X = (instruction->raw).field_3.rex.X;
              (pZVar9->vector_unified).B = (instruction->raw).field_3.rex.B;
              ZVar16 = decoder->machine_mode;
            }
            if ((ZVar16 != ZYDIS_MACHINE_MODE_LONG_64) && ((char)local_78 == '>')) {
              local_c0.prefixes.offset_notrack = (char)local_80;
              local_c0.prefixes.offset_osz_override = (char)uVar1;
              local_c0.prefixes.offset_asz_override = (char)((uint)uVar1 >> 8);
              local_c0.prefixes.offset_segment = (char)((uint)uVar1 >> 0x10);
              local_c0.prefixes.offset_mandatory = (char)((uint)uVar1 >> 0x18);
            }
            ZVar6 = ZydisDecodeInstruction(&local_c0,instruction);
            if ((int)ZVar6 < 0) {
              return ZVar6;
            }
            (instruction->raw).encoding2 = instruction->encoding;
            return 0x100000;
          }
          uVar13 = uVar21 & 0xffffffff;
LAB_0010ef1c:
          (instruction->raw).field_3.rex.offset = ZVar10;
        }
        else {
          if (bVar5 - 0xf2 < 2) {
            uVar18 = uVar11 & 0xffffffff;
            uVar17 = uVar21 & 0xffffffff;
            local_c8 = bVar5;
            local_c7 = ZVar10;
            local_c4 = (uint)uVar21;
          }
          else if (uVar15 == 0x67) {
            local_90 = local_90 | 0x100000000000;
            instruction->attributes = local_90;
            local_68 = CONCAT71((int7)(local_90 >> 8),ZVar10);
            local_cb = ZVar10;
          }
          else {
            if (uVar15 != 0xf0) goto LAB_0010ef51;
            local_ca = '\x01';
            local_c9 = ZVar10;
          }
LAB_0010ef08:
          if (bVar12 != bVar5 && bVar12 != 0) {
            ZVar10 = '\0';
            uVar13 = 0;
            goto LAB_0010ef1c;
          }
        }
        uVar21 = uVar11 + 1;
        (instruction->raw).prefix_count = (ZyanU8)uVar21;
        (instruction->raw).prefixes[uVar11].value = bVar5;
        instruction->length = (ZyanU8)uVar21;
        local_c0.buffer = pZVar19 + 1;
        local_c0.buffer_len = length - 1;
        uVar11 = uVar21;
        pZVar19 = local_c0.buffer;
        length = local_c0.buffer_len;
        ZVar20 = local_c0.buffer_len;
      } while (uVar21 != 0xf);
      ZVar6 = 0x80200002;
    }
  }
  return ZVar6;
}

Assistant:

ZyanStatus ZydisDecoderDecodeInstruction(const ZydisDecoder* decoder, ZydisDecoderContext* context,
    const void* buffer, ZyanUSize length, ZydisDecodedInstruction* instruction)
{
    if (!decoder || !instruction || !buffer)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (!length)
    {
        return ZYDIS_STATUS_NO_MORE_DATA;
    }

    ZydisDecoderState state;
    ZYAN_MEMSET(&state, 0, sizeof(state));
    state.decoder = decoder;
    state.buffer = (const ZyanU8*)buffer;
    state.buffer_len = length;
    state.prefixes.offset_notrack = -1;

    ZydisDecoderContext default_context;
    if (!context)
    {
        // Use a fallback context if no custom one has been provided
        context = &default_context;
    }
    ZYAN_MEMSET(context, 0, sizeof(*context));
    state.context = context;

    ZYAN_MEMSET(instruction, 0, sizeof(*instruction));
    instruction->machine_mode = decoder->machine_mode;
    instruction->stack_width = 16 << decoder->stack_width;

    ZYAN_CHECK(ZydisCollectOptionalPrefixes(&state, instruction));
    ZYAN_CHECK(ZydisDecodeInstruction(&state, instruction));

    instruction->raw.encoding2 = instruction->encoding;

    return ZYAN_STATUS_SUCCESS;
}